

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

ModelPtr __thiscall libcellml::Importer::library(Importer *this,size_t *index)

{
  pointer puVar1;
  LoggerImpl *pLVar2;
  _Rb_tree_node_base *p_Var3;
  ulong *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ulong uVar5;
  bool bVar6;
  ModelPtr MVar7;
  
  puVar1 = (pointer)*in_RDX;
  pLVar2 = Logger::pFunc((Logger *)index);
  if (puVar1 < pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start) {
    pLVar2 = Logger::pFunc((Logger *)index);
    p_Var3 = (_Rb_tree_node_base *)
             pLVar2[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar5 = *in_RDX;
    while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 2));
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    (this->super_Logger)._vptr_Logger = (_func_int **)0x0;
    (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
    _Var4._M_pi = extraout_RDX;
  }
  MVar7.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  MVar7.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar7.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::library(const size_t &index)
{
    if (index >= pFunc()->mLibrary.size()) {
        return nullptr;
    }
    auto it = pFunc()->mLibrary.begin();
    size_t i = 0;
    while (i < index) {
        ++it;
        ++i;
    }
    return it->second;
}